

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.cpp
# Opt level: O0

bool __thiscall HighsLpRelaxation::LpRow::isIntegral(LpRow *this,HighsMipSolver *mipsolver)

{
  pointer pHVar1;
  reference pvVar2;
  int *in_RDI;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar3;
  bool local_1;
  
  iVar3 = *in_RDI;
  if (iVar3 == 0) {
    pHVar1 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
             operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                        0x602edb);
    pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&pHVar1->rowintegral,(long)in_RDI[1]);
    local_1 = *pvVar2 != '\0';
  }
  else if (iVar3 == 1) {
    std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
              ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x602eaf)
    ;
    local_1 = HighsCutPool::cutIsIntegral
                        ((HighsCutPool *)CONCAT44(iVar3,in_stack_ffffffffffffffe0),
                         (HighsInt)((ulong)in_RDI >> 0x20));
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool HighsLpRelaxation::LpRow::isIntegral(
    const HighsMipSolver& mipsolver) const {
  switch (origin) {
    case kCutPool:
      return mipsolver.mipdata_->cutpool.cutIsIntegral(index);
    case kModel:
      return (mipsolver.mipdata_->rowintegral[index] != 0);
  };

  assert(false);
  return false;
}